

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O0

char * __thiscall Fossilize::CLIParser::next_string(CLIParser *this)

{
  char *pcVar1;
  char *ret;
  CLIParser *this_local;
  
  if (this->argc == 0) {
    fprintf(_stderr,"Fossilize ERROR: Tried to parse string, but nothing left in arguments.\n");
    fflush(_stderr);
    exit(1);
  }
  pcVar1 = *this->argv;
  this->argc = this->argc + -1;
  this->argv = this->argv + 1;
  return pcVar1;
}

Assistant:

const char *CLIParser::next_string()
{
	if (!argc)
	{
		LOGE("Tried to parse string, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	const char *ret = *argv;
	argc--;
	argv++;
	return ret;
}